

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-connect-prepare.c
# Opt level: O2

int run_test_pipe_connect_on_prepare(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  int64_t eval_b;
  int64_t eval_a;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar2,&pipe_handle,0);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_prepare_init(puVar2,&prepare_handle);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      iVar1 = uv_prepare_start(&prepare_handle,prepare_cb);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        puVar2 = uv_default_loop();
        iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          eval_a = 2;
          eval_b = (int64_t)close_cb_called;
          if (eval_b == 2) {
            eval_a = 1;
            eval_b = (int64_t)connect_cb_called;
            if (eval_b == 1) {
              puVar2 = uv_default_loop();
              uv_walk(puVar2,close_walk_cb,(void *)0x0);
              uv_run(puVar2,UV_RUN_DEFAULT);
              eval_a = 0;
              puVar2 = uv_default_loop();
              iVar1 = uv_loop_close(puVar2);
              eval_b = (int64_t)iVar1;
              if (eval_b == 0) {
                uv_library_shutdown();
                return 0;
              }
              pcVar4 = "uv_loop_close(uv_default_loop())";
              pcVar3 = "0";
              uVar5 = 0x51;
            }
            else {
              pcVar4 = "connect_cb_called";
              pcVar3 = "1";
              uVar5 = 0x4f;
            }
          }
          else {
            pcVar4 = "close_cb_called";
            pcVar3 = "2";
            uVar5 = 0x4e;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "r";
          uVar5 = 0x4c;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "r";
        uVar5 = 0x49;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "r";
      uVar5 = 0x47;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "r";
    uVar5 = 0x44;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-connect-prepare.c"
          ,uVar5,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(pipe_connect_on_prepare) {
  int r;

  r = uv_pipe_init(uv_default_loop(), &pipe_handle, 0);
  ASSERT_OK(r);

  r = uv_prepare_init(uv_default_loop(), &prepare_handle);
  ASSERT_OK(r);
  r = uv_prepare_start(&prepare_handle, prepare_cb);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(2, close_cb_called);
  ASSERT_EQ(1, connect_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}